

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O0

Ref __thiscall
anon_unknown.dwarf_b296a::AssertionEmitter::emitAssertReturnFunc
          (AssertionEmitter *this,AssertReturn *assn,Module *wasm,Name testFuncName,Name asmModule)

{
  initializer_list<wasm::Expression_*> __l;
  initializer_list<wasm::Expression_*> __l_00;
  initializer_list<wasm::Expression_*> __l_01;
  IString str;
  initializer_list<wasm::Expression_*> __l_02;
  bool bVar1;
  BasicType BVar2;
  size_type sVar3;
  Module *any;
  Const *append;
  Builder BVar4;
  reference pvVar5;
  Fatal *pFVar6;
  Expression *pEVar7;
  add_pointer_t<wasm::WATParser::NaNResult> ptVar8;
  pointer func;
  Name name;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> local_8e8;
  uintptr_t local_8d0;
  Type local_8c8;
  Signature local_8c0;
  HeapType local_8b0;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> local_8a8;
  AssertionEmitter *local_888;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *pvStack_880;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_870;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> testFunc;
  allocator<wasm::Expression_*> local_859;
  Module *local_858;
  Module **local_850;
  size_type local_848;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_840;
  string_view local_828;
  Fatal local_818;
  Type local_690;
  allocator<wasm::Expression_*> local_681;
  Module *local_680;
  Expression *local_678;
  Module **local_670;
  size_type local_668;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_660;
  string_view local_648;
  Type local_638;
  allocator<wasm::Expression_*> local_629;
  Module *local_628;
  Expression *local_620;
  Module **local_618;
  size_type local_610;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_608;
  string_view local_5f0;
  Type local_5e0;
  allocator<wasm::Expression_*> local_5d1;
  Type local_5d0;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_5c8;
  size_t local_5a8;
  char *pcStack_5a0;
  string_view local_590;
  Module *local_580;
  Call *local_578;
  Expression *local_570;
  Module **local_568;
  size_type local_560;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_558;
  string_view local_540;
  Literal local_530;
  Expression *local_518;
  Expression *expected;
  Literal *local_388;
  type *expectedVal;
  Builder local_378;
  Builder builder;
  Expression *body;
  Expression *actual;
  add_pointer_t<wasm::WATParser::InvokeAction> local_1d8;
  type *invoke;
  Fatal local_1c0;
  Module *local_38;
  Module *wasm_local;
  AssertReturn *assn_local;
  AssertionEmitter *this_local;
  Name testFuncName_local;
  Ref jsFunc;
  
  testFuncName_local.super_IString.str._M_len = testFuncName.super_IString.str._M_str;
  this_local = testFuncName.super_IString.str._M_len;
  local_38 = wasm;
  wasm_local = (Module *)assn;
  assn_local = (AssertReturn *)this;
  sVar3 = std::
          vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
          ::size(&assn->expected);
  if (1 < sVar3) {
    ::wasm::Fatal::Fatal(&local_1c0);
    ::wasm::Fatal::operator<<(&local_1c0,(char (*) [39])"multivalue assert_return not supported");
    ::wasm::Fatal::~Fatal(&local_1c0);
  }
  local_1d8 = std::
              get_if<wasm::WATParser::InvokeAction,wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>
                        ((variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction> *)
                         wasm_local);
  if (local_1d8 != (add_pointer_t<wasm::WATParser::InvokeAction>)0x0) {
    any = (Module *)translateInvoke(this,local_1d8,local_38);
    builder.wasm = (Module *)0x0;
    ::wasm::Builder::Builder(&local_378,local_38);
    bVar1 = std::
            vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
            ::empty((vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                     *)&(wasm_local->elementSegments).
                        super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar1) {
      expectedVal._4_4_ = 0;
      bVar1 = ::wasm::Type::operator==
                        ((Type *)&(any->exports).
                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                         (BasicType *)((long)&expectedVal + 4));
      BVar4.wasm = any;
      if (bVar1) {
        append = ::wasm::Builder::makeConst<unsigned_int>(&local_378,1);
        BVar4.wasm = (Module *)
                     ::wasm::Builder::blockify(&local_378,(Expression *)any,(Expression *)append);
      }
    }
    else {
      pvVar5 = std::
               vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
               ::operator[]((vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                             *)&(wasm_local->elementSegments).
                                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,0);
      local_388 = std::
                  get_if<wasm::Literal,wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>
                            (pvVar5);
      if (local_388 == (add_pointer_t<wasm::Literal>)0x0) {
        pvVar5 = std::
                 vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                 ::operator[]((vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                               *)&(wasm_local->elementSegments).
                                  super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,0);
        ptVar8 = std::
                 get_if<wasm::WATParser::NaNResult,wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>
                           (pvVar5);
        BVar4 = builder;
        if (ptVar8 != (add_pointer_t<wasm::WATParser::NaNResult>)0x0) {
          ::wasm::Name::Name((Name *)&local_828,"isNaN");
          local_850 = &local_858;
          local_848 = 1;
          local_858 = any;
          std::allocator<wasm::Expression_*>::allocator(&local_859);
          __l._M_len = local_848;
          __l._M_array = (iterator)local_850;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                    (&local_840,__l,&local_859);
          ::wasm::Type::Type((Type *)&testFunc,i32);
          builder.wasm = (Module *)
                         ::wasm::Builder::makeCall
                                   (&local_378,(Name)local_828,&local_840,
                                    (Type)testFunc._M_t.
                                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                          .super__Head_base<0UL,_wasm::Function_*,_false>.
                                          _M_head_impl,false);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_840);
          std::allocator<wasm::Expression_*>::~allocator(&local_859);
          BVar4 = builder;
        }
      }
      else {
        bVar1 = ::wasm::Type::isBasic(&local_388->type);
        if (!bVar1) {
          ::wasm::Fatal::Fatal((Fatal *)&expected);
          pFVar6 = ::wasm::Fatal::operator<<
                             ((Fatal *)&expected,
                              (char (*) [36])"unsupported type in assert_return: ");
          ::wasm::Fatal::operator<<(pFVar6,&local_388->type);
          ::wasm::Fatal::~Fatal((Fatal *)&expected);
        }
        ::wasm::Literal::Literal(&local_530,local_388);
        pEVar7 = ::wasm::Builder::makeConstantExpression(&local_378,&local_530);
        ::wasm::Literal::~Literal(&local_530);
        local_518 = pEVar7;
        BVar2 = ::wasm::Type::getBasic(&pEVar7->type);
        switch(BVar2) {
        case i32:
          BVar4.wasm = (Module *)
                       ::wasm::Builder::makeBinary(&local_378,EqInt32,(Expression *)any,local_518);
          break;
        case i64:
          ::wasm::Name::Name((Name *)&local_540,"i64Equal");
          local_5a8 = ::wasm::WASM_FETCH_HIGH_BITS;
          pcStack_5a0 = __ITM_deregisterTMCloneTable;
          str.str._M_str = __ITM_deregisterTMCloneTable;
          str.str._M_len = ::wasm::WASM_FETCH_HIGH_BITS;
          local_580 = any;
          ::wasm::Name::Name((Name *)&local_590,str);
          local_5c8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_5c8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_5c8.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector(&local_5c8);
          ::wasm::Type::Type(&local_5d0,i32);
          local_578 = ::wasm::Builder::makeCall
                                (&local_378,(Name)local_590,&local_5c8,local_5d0,false);
          local_570 = local_518;
          local_568 = &local_580;
          local_560 = 3;
          std::allocator<wasm::Expression_*>::allocator(&local_5d1);
          __l_02._M_len = local_560;
          __l_02._M_array = (iterator)local_568;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                    (&local_558,__l_02,&local_5d1);
          ::wasm::Type::Type(&local_5e0,i32);
          builder.wasm = (Module *)
                         ::wasm::Builder::makeCall
                                   (&local_378,(Name)local_540,&local_558,local_5e0,false);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_558);
          std::allocator<wasm::Expression_*>::~allocator(&local_5d1);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_5c8);
          BVar4 = builder;
          break;
        case f32:
          ::wasm::Name::Name((Name *)&local_5f0,"f32Equal");
          local_620 = local_518;
          local_618 = &local_628;
          local_610 = 2;
          local_628 = any;
          std::allocator<wasm::Expression_*>::allocator(&local_629);
          __l_01._M_len = local_610;
          __l_01._M_array = (iterator)local_618;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                    (&local_608,__l_01,&local_629);
          ::wasm::Type::Type(&local_638,i32);
          builder.wasm = (Module *)
                         ::wasm::Builder::makeCall
                                   (&local_378,(Name)local_5f0,&local_608,local_638,false);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_608);
          std::allocator<wasm::Expression_*>::~allocator(&local_629);
          BVar4 = builder;
          break;
        case f64:
          ::wasm::Name::Name((Name *)&local_648,"f64Equal");
          local_678 = local_518;
          local_670 = &local_680;
          local_668 = 2;
          local_680 = any;
          std::allocator<wasm::Expression_*>::allocator(&local_681);
          __l_00._M_len = local_668;
          __l_00._M_array = (iterator)local_670;
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                    (&local_660,__l_00,&local_681);
          ::wasm::Type::Type(&local_690,i32);
          builder.wasm = (Module *)
                         ::wasm::Builder::makeCall
                                   (&local_378,(Name)local_648,&local_660,local_690,false);
          std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_660);
          std::allocator<wasm::Expression_*>::~allocator(&local_681);
          BVar4 = builder;
          break;
        default:
          ::wasm::Fatal::Fatal(&local_818);
          pFVar6 = ::wasm::Fatal::operator<<(&local_818,(char (*) [27])"Unhandled type in assert: ")
          ;
          ::wasm::Fatal::operator<<(pFVar6,&local_518->type);
          ::wasm::Fatal::~Fatal(&local_818);
        }
      }
    }
    builder.wasm = BVar4.wasm;
    local_888 = this_local;
    pvStack_880 = (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)
                  testFuncName_local.super_IString.str._M_len;
    local_8a8.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_8a8.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_8a8.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::vector(&local_8a8);
    ::wasm::Type::Type(&local_8c8,none);
    local_8d0 = (uintptr_t)
                ((builder.wasm)->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    ::wasm::Signature::Signature(&local_8c0,local_8c8,(Type)local_8d0);
    ::wasm::HeapType::HeapType(&local_8b0,local_8c0);
    local_8e8.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_8e8.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_8e8.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::vector(&local_8e8);
    name.super_IString.str._M_str = (char *)local_888;
    name.super_IString.str._M_len = (size_t)&local_870;
    ::wasm::Builder::makeFunction
              (name,pvStack_880,(HeapType)&local_8a8,
               (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)local_8b0.id,
               (Expression *)&local_8e8);
    std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::~vector(&local_8e8);
    std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::~vector(&local_8a8);
    func = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(&local_870);
    testFuncName_local.super_IString.str._M_str = (char *)processFunction(this,func);
    fixCalls(this,(Ref)testFuncName_local.super_IString.str._M_str,asmModule);
    emitFunction(this,(Ref)testFuncName_local.super_IString.str._M_str);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_870);
    return (Ref)(Value *)testFuncName_local.super_IString.str._M_str;
  }
  ::wasm::Fatal::Fatal((Fatal *)&actual);
  ::wasm::Fatal::operator<<
            ((Fatal *)&actual,(char (*) [51])"only invoke actions are supported in assert_return");
  ::wasm::Fatal::~Fatal((Fatal *)&actual);
}

Assistant:

Ref AssertionEmitter::emitAssertReturnFunc(AssertReturn& assn,
                                           Module& wasm,
                                           Name testFuncName,
                                           Name asmModule) {
  if (assn.expected.size() > 1) {
    Fatal() << "multivalue assert_return not supported";
  }
  auto* invoke = std::get_if<InvokeAction>(&assn.action);
  if (!invoke) {
    Fatal() << "only invoke actions are supported in assert_return";
  }
  Expression* actual = translateInvoke(*invoke, wasm);
  Expression* body = nullptr;
  Builder builder(wasm);
  if (assn.expected.empty()) {
    if (actual->type == Type::none) {
      body = builder.blockify(actual, builder.makeConst(uint32_t(1)));
    } else {
      body = actual;
    }
  } else if (auto* expectedVal = std::get_if<Literal>(&assn.expected[0])) {
    if (!expectedVal->type.isBasic()) {
      Fatal() << "unsupported type in assert_return: " << expectedVal->type;
    }
    Expression* expected = builder.makeConstantExpression(*expectedVal);
    switch (expected->type.getBasic()) {
      case Type::i32:
        body = builder.makeBinary(EqInt32, actual, expected);
        break;
      case Type::i64:
        body = builder.makeCall(
          "i64Equal",
          {actual,
           builder.makeCall(WASM_FETCH_HIGH_BITS, {}, Type::i32),
           expected},
          Type::i32);
        break;
      case Type::f32: {
        body = builder.makeCall("f32Equal", {actual, expected}, Type::i32);
        break;
      }
      case Type::f64: {
        body = builder.makeCall("f64Equal", {actual, expected}, Type::i32);
        break;
      }
      default: {
        Fatal() << "Unhandled type in assert: " << expected->type;
      }
    }
  } else if (std::get_if<NaNResult>(&assn.expected[0])) {
    body = builder.makeCall("isNaN", {actual}, Type::i32);
  }
  std::unique_ptr<Function> testFunc(
    builder.makeFunction(testFuncName,
                         std::vector<NameType>{},
                         Signature(Type::none, body->type),
                         std::vector<NameType>{},
                         body));
  Ref jsFunc = processFunction(testFunc.get());
  fixCalls(jsFunc, asmModule);
  emitFunction(jsFunc);
  return jsFunc;
}